

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  TestRole TVar6;
  UnitTestImpl *pUVar7;
  int *piVar8;
  void *__addr;
  undefined8 extraout_RAX;
  long lVar9;
  size_t __len;
  allocator local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  int pipe_fd [2];
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  Arguments args;
  string local_1d0;
  ExecDeathTestArgs args_1;
  sigaction saved_sigprof_action;
  sigaction ignore_sigprof_action;
  string internal_flag;
  string filter_flag;
  
  pUVar7 = GetUnitTestImpl();
  pTVar1 = pUVar7->current_test_info_;
  pIVar2 = (pUVar7->internal_run_death_test_flag_).ptr_;
  death_test_index = (pTVar1->result_).death_test_count_;
  if (pIVar2 == (InternalRunDeathTestFlag *)0x0) {
    iVar3 = pipe(pipe_fd);
    if (iVar3 == -1) {
      std::__cxx11::string::string
                ((string *)&local_300,"CHECK failed: File ",(allocator *)&local_240);
      std::operator+(&local_2e0,&local_300,
                     "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                    );
      std::operator+(&local_2c0,&local_2e0,", line ");
      local_260._M_dataplus._M_p._0_4_ = 0x1db7;
      StreamableToString<int>(&local_280,(int *)&local_260);
      std::operator+(&local_2a0,&local_2c0,&local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,&local_2a0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &saved_sigprof_action,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,"pipe(pipe_fd) != -1");
      DeathTestAbort((string *)&saved_sigprof_action);
    }
    else {
      iVar3 = fcntl(pipe_fd[1],2,0);
      if (iVar3 != -1) {
        std::__cxx11::string::string((string *)&local_300,"--",(allocator *)&local_280);
        std::operator+(&local_2e0,&local_300,"gtest_");
        std::operator+(&local_2c0,&local_2e0,"filter");
        std::operator+(&local_2a0,&local_2c0,"=");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,&local_2a0,(pTVar1->test_case_name_)._M_dataplus._M_p)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &saved_sigprof_action,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,".");
        std::operator+(&filter_flag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &saved_sigprof_action,(pTVar1->name_)._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&saved_sigprof_action);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::string((string *)&local_210,"--",&local_301);
        std::operator+(&local_240,&local_210,"gtest_");
        std::operator+(&local_260,&local_240,"internal_run_death_test");
        std::operator+(&local_280,&local_260,"=");
        std::operator+(&local_300,&local_280,this->file_);
        std::operator+(&local_2e0,&local_300,"|");
        StreamableToString<int>((string *)&args,&this->line_);
        std::operator+(&local_2c0,&local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
        std::operator+(&local_2a0,&local_2c0,"|");
        StreamableToString<int>((string *)&args_1,&death_test_index);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,&local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &saved_sigprof_action,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,"|");
        StreamableToString<int>(&local_1d0,pipe_fd + 1);
        std::operator+(&internal_flag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &saved_sigprof_action,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&saved_sigprof_action);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action);
        std::__cxx11::string::~string((string *)&args_1);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&args);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_210);
        Arguments::Arguments(&args);
        GetArgvsForDeathTestChildProcess_abi_cxx11_();
        Arguments::AddArguments<std::__cxx11::string>
                  (&args,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&saved_sigprof_action);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&saved_sigprof_action);
        Arguments::AddArgument(&args,filter_flag._M_dataplus._M_p);
        Arguments::AddArgument(&args,internal_flag._M_dataplus._M_p);
        std::__cxx11::string::string
                  ((string *)&saved_sigprof_action,"",(allocator *)&ignore_sigprof_action);
        DeathTest::set_last_death_test_message((string *)&saved_sigprof_action);
        std::__cxx11::string::~string((string *)&saved_sigprof_action);
        CaptureStderr();
        FlushInfoLog();
        args_1.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
        args_1.close_fd = pipe_fd[0];
        memset((sigaction *)&ignore_sigprof_action,0,0x98);
        sigemptyset((sigset_t *)&ignore_sigprof_action.sa_mask);
        ignore_sigprof_action.__sigaction_handler =
             (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
        do {
          iVar3 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action,
                            (sigaction *)&saved_sigprof_action);
          if (iVar3 != -1) goto LAB_0013fba2;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        std::__cxx11::string::string((string *)&local_240,"CHECK failed: File ",&local_301);
        std::operator+(&local_260,&local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                      );
        std::operator+(&local_280,&local_260,", line ");
        local_1d0._M_dataplus._M_p._0_4_ = 0x1d75;
        StreamableToString<int>(&local_210,(int *)&local_1d0);
        std::operator+(&local_300,&local_280,&local_210);
        std::operator+(&local_2e0,&local_300,": ");
        std::operator+(&local_2c0,&local_2e0,
                       "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
        std::operator+(&local_2a0,&local_2c0," != -1");
        DeathTestAbort(&local_2a0);
LAB_0013fba2:
        if (FLAGS_gtest_death_test_use_fork != '\0') {
          iVar3 = fork();
          if (iVar3 == 0) goto LAB_001400bf;
          goto LAB_0013fc51;
        }
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_001400cc;
        goto LAB_0013fbcd;
      }
    }
    std::__cxx11::string::string((string *)&local_300,"CHECK failed: File ",(allocator *)&local_240)
    ;
    std::operator+(&local_2e0,&local_300,
                   "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                  );
    std::operator+(&local_2c0,&local_2e0,", line ");
    local_260._M_dataplus._M_p._0_4_ = 0x1dba;
    StreamableToString<int>(&local_280,(int *)&local_260);
    std::operator+(&local_2a0,&local_2c0,&local_280);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2a0,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &saved_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    DeathTestAbort((string *)&saved_sigprof_action);
    do {
      std::__cxx11::string::string
                ((string *)&local_260,"CHECK failed: File ",(allocator *)&local_1d0);
      std::operator+(&local_280,&local_260,
                     "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                    );
      std::operator+(&local_300,&local_280,", line ");
      local_210._M_dataplus._M_p._0_4_ = 0x1da2;
      StreamableToString<int>(&local_240,(int *)&local_210);
      std::operator+(&local_2e0,&local_300,&local_240);
      std::operator+(&local_2c0,&local_2e0,": ");
      std::operator+(&local_2a0,&local_2c0,"child_pid != -1");
      DeathTestAbort(&local_2a0);
LAB_001400bf:
      ExecDeathTestChildMain(&args_1);
LAB_001400cc:
      iVar3 = __cxa_guard_acquire();
      if (iVar3 != 0) {
        ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = StackGrowsDown();
        __cxa_guard_release();
      }
LAB_0013fbcd:
      uVar4 = getpagesize();
      __len = (size_t)(int)uVar4;
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        std::__cxx11::string::string
                  ((string *)&local_260,"CHECK failed: File ",(allocator *)&local_1d0);
        std::operator+(&local_280,&local_260,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                      );
        std::operator+(&local_300,&local_280,", line ");
        local_210._M_dataplus._M_p._0_4_ = 0x1d81;
        StreamableToString<int>(&local_240,(int *)&local_210);
        std::operator+(&local_2e0,&local_300,&local_240);
        std::operator+(&local_2c0,&local_2e0,": ");
        std::operator+(&local_2a0,&local_2c0,"stack != MAP_FAILED");
        DeathTestAbort(&local_2a0);
LAB_001401b5:
        std::__cxx11::string::string
                  ((string *)&local_260,"CHECK failed: File ",(allocator *)&local_1d0);
        std::operator+(&local_280,&local_260,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                      );
        std::operator+(&local_300,&local_280,", line ");
        local_210._M_dataplus._M_p._0_4_ = 0x1d8e;
        StreamableToString<int>(&local_240,(int *)&local_210);
        std::operator+(&local_2e0,&local_300,&local_240);
        std::operator+(&local_2c0,&local_2e0,": ");
        std::operator+(&local_2a0,&local_2c0,
                       "stack_size > kMaxStackAlignment && reinterpret_cast<intptr_t>(stack_top) % kMaxStackAlignment == 0"
                      );
        DeathTestAbort(&local_2a0);
LAB_0014026e:
        std::__cxx11::string::string
                  ((string *)&local_260,"CHECK failed: File ",(allocator *)&local_1d0);
        std::operator+(&local_280,&local_260,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                      );
        std::operator+(&local_300,&local_280,", line ");
        local_210._M_dataplus._M_p._0_4_ = 0x1d92;
        StreamableToString<int>(&local_240,(int *)&local_210);
        std::operator+(&local_2e0,&local_300,&local_240);
        std::operator+(&local_2c0,&local_2e0,": ");
        std::operator+(&local_2a0,&local_2c0,"munmap(stack, stack_size) != -1");
        DeathTestAbort(&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_260);
        Arguments::~Arguments(&args);
        std::__cxx11::string::~string((string *)&internal_flag);
        std::__cxx11::string::~string((string *)&filter_flag);
        _Unwind_Resume(extraout_RAX);
      }
      lVar9 = 0;
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
        lVar9 = __len - 0x40;
      }
      if ((uVar4 < 0x41) || (((ulong)(lVar9 + (long)__addr) & 0x3f) != 0)) goto LAB_001401b5;
      iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar9 + (long)__addr),0x11,&args_1);
      iVar5 = munmap(__addr,__len);
      if (iVar5 == -1) goto LAB_0014026e;
LAB_0013fc51:
      do {
        iVar5 = sigaction(0x1b,(sigaction *)&saved_sigprof_action,(sigaction *)0x0);
        if (iVar5 != -1) goto LAB_0013fd4f;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      std::__cxx11::string::string((string *)&local_240,"CHECK failed: File ",&local_301);
      std::operator+(&local_260,&local_240,
                     "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                    );
      std::operator+(&local_280,&local_260,", line ");
      local_1d0._M_dataplus._M_p._0_4_ = 0x1d9f;
      StreamableToString<int>(&local_210,(int *)&local_1d0);
      std::operator+(&local_300,&local_280,&local_210);
      std::operator+(&local_2e0,&local_300,": ");
      std::operator+(&local_2c0,&local_2e0,"sigaction(SIGPROF, &saved_sigprof_action, NULL)");
      std::operator+(&local_2a0,&local_2c0," != -1");
      DeathTestAbort(&local_2a0);
LAB_0013fd4f:
    } while (iVar3 == -1);
    do {
      iVar5 = close(pipe_fd[1]);
      if (iVar5 != -1) goto LAB_0013fe4c;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    std::__cxx11::string::string((string *)&local_280,"CHECK failed: File ",(allocator *)&local_210)
    ;
    std::operator+(&local_300,&local_280,
                   "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/3rd-party/gmock-1.7.0/gmock-gtest-all.cc"
                  );
    std::operator+(&local_2e0,&local_300,", line ");
    local_240._M_dataplus._M_p._0_4_ = 0x1dd1;
    StreamableToString<int>(&local_260,(int *)&local_240);
    std::operator+(&local_2c0,&local_2e0,&local_260);
    std::operator+(&local_2a0,&local_2c0,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2a0,"close(pipe_fd[1])");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &saved_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action," != -1");
    DeathTestAbort((string *)&saved_sigprof_action);
LAB_0013fe4c:
    *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar3;
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    Arguments::~Arguments(&args);
    std::__cxx11::string::~string((string *)&internal_flag);
    std::__cxx11::string::~string((string *)&filter_flag);
    TVar6 = OVERSEE_TEST;
  }
  else {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    TVar6 = EXECUTE_TEST;
  }
  return TVar6;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}